

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O0

bool CoreML::Specification::mapsEqual<CoreML::Specification::Int64ToStringMap>
               (Int64ToStringMap *a,Int64ToStringMap *b)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pMVar4;
  const_reference key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  value_type *p;
  const_iterator __end0;
  const_iterator __begin0;
  Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range2;
  Int64ToStringMap *b_local;
  Int64ToStringMap *a_local;
  
  iVar2 = Int64ToStringMap::map_size(a);
  iVar3 = Int64ToStringMap::map_size(b);
  if (iVar2 == iVar3) {
    pMVar4 = Int64ToStringMap::map_abi_cxx11_(a);
    google::protobuf::
    Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    begin((const_iterator *)&__end0.it_.bucket_index_,pMVar4);
    google::protobuf::
    Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::end
              ((const_iterator *)&p,pMVar4);
    while (bVar1 = google::protobuf::operator!=
                             ((const_iterator *)&__end0.it_.bucket_index_,(const_iterator *)&p),
          bVar1) {
      key = google::protobuf::
            Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::const_iterator::operator*((const_iterator *)&__end0.it_.bucket_index_);
      pMVar4 = Int64ToStringMap::map_abi_cxx11_(b);
      __rhs = google::protobuf::
              Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::at(pMVar4,&key->first);
      bVar1 = std::operator!=(&key->second,__rhs);
      if (bVar1) {
        return false;
      }
      google::protobuf::
      Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      const_iterator::operator++((const_iterator *)&__end0.it_.bucket_index_);
    }
    a_local._7_1_ = true;
  }
  else {
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool mapsEqual(const T& a, const T& b) {
            if (a.map_size() != b.map_size()) {
                return false;
            }
            for (const auto& p : a.map()) {
                if (p.second != b.map().at(p.first)) {
                    return false;
                }
            }
            return true;
        }